

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ApiExit(sqlite3 *db,int rc)

{
  uint uVar1;
  
  if ((db != (sqlite3 *)0x0) && ((rc == 0xc0a || (db->mallocFailed != '\0')))) {
    rc = 7;
    sqlite3Error(db,7,(char *)0x0);
    db->mallocFailed = '\0';
  }
  if (db == (sqlite3 *)0x0) {
    uVar1 = 0xff;
  }
  else {
    uVar1 = db->errMask;
  }
  return uVar1 & rc;
}

Assistant:

SQLITE_PRIVATE int sqlite3ApiExit(sqlite3* db, int rc){
  /* If the db handle is not NULL, then we must hold the connection handle
  ** mutex here. Otherwise the read (and possible write) of db->mallocFailed 
  ** is unsafe, as is the call to sqlite3Error().
  */
  assert( !db || sqlite3_mutex_held(db->mutex) );
  if( db && (db->mallocFailed || rc==SQLITE_IOERR_NOMEM) ){
    sqlite3Error(db, SQLITE_NOMEM, 0);
    db->mallocFailed = 0;
    rc = SQLITE_NOMEM;
  }
  return rc & (db ? db->errMask : 0xff);
}